

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getQuery
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_httpreq_ext *pvVar2;
  CVmObjHTTPRequest *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  if ((getp_getQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getQuery::desc,0);
    __cxa_guard_release(&getp_getQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    pvVar2 = get_ext(in_RDI);
    StringRef::get(pvVar2->req->resource_name);
    new_ascii_string(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getQuery(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* create a validated ASCII string for the query string */
    new_ascii_string(vmg_ retval, get_ext()->req->resource_name->get());

    /* handled */
    return TRUE;
}